

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall Assimp::IFC::Schema_2x3::IfcShapeModel::IfcShapeModel(IfcShapeModel *this)

{
  IfcShapeModel *this_local;
  
  STEP::Object::Object((Object *)&(this->super_IfcRepresentation).field_0x90,"IfcShapeModel");
  IfcRepresentation::IfcRepresentation
            (&this->super_IfcRepresentation,&PTR_construction_vtable_24__00fb7ab8);
  STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcShapeModel,_0UL>::ObjectHelper
            ((ObjectHelper<Assimp::IFC::Schema_2x3::IfcShapeModel,_0UL> *)
             &(this->super_IfcRepresentation).field_0x80,&PTR_construction_vtable_24__00fb7ad8);
  (this->super_IfcRepresentation).
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentation,_4UL>._vptr_ObjectHelper =
       (_func_int **)0xfb7a50;
  *(undefined8 *)&(this->super_IfcRepresentation).field_0x90 = 0xfb7aa0;
  *(undefined8 *)&(this->super_IfcRepresentation).field_0x80 = 0xfb7a78;
  return;
}

Assistant:

IfcShapeModel() : Object("IfcShapeModel") {}